

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_btype.cc
# Opt level: O1

void BuiltInType::static_init(void)

{
  Type *this;
  long lVar1;
  char **ppcVar2;
  allocator<char> local_51;
  string local_50;
  
  ppcVar2 = basic_pactype_name;
  lVar1 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar2,&local_51);
    this = (Type *)operator_new(400);
    Type::Type(this,(uint)(lVar1 != 8));
    (this->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Type_001443c0;
    *(int *)&this->field_0x18c = (int)lVar1;
    Type::AddPredefinedType(&local_50,this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar1 = lVar1 + 1;
    ppcVar2 = ppcVar2 + 1;
  } while (lVar1 != 9);
  return;
}

Assistant:

void BuiltInType::static_init()
	{
	for ( int bit_type = 0; basic_pactype_name[bit_type]; ++bit_type )
		{
		Type::AddPredefinedType(basic_pactype_name[bit_type], new BuiltInType((BITType)bit_type));
		}
	}